

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O2

void mocker::anon_unknown_0::genArithBinary
               (Section *text,FuncSelectionContext *ctx,
               shared_ptr<mocker::ir::ArithBinaryInst> *inst)

{
  OpType OVar1;
  element_type *peVar2;
  undefined1 *puVar3;
  undefined8 uVar4;
  int iVar5;
  shared_ptr<mocker::nasm::Register> *psVar6;
  OpType *args;
  shared_ptr<mocker::nasm::Register> raxCopy;
  shared_ptr<mocker::nasm::Addr> dest;
  shared_ptr<mocker::nasm::Addr> lhs;
  shared_ptr<mocker::nasm::Register> rdxCopy;
  shared_ptr<mocker::nasm::Register> divisor;
  undefined1 local_a8 [16];
  undefined1 local_98 [40];
  __buckets_ptr pp_Stack_70;
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined1 local_40 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  peVar2 = (inst->super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  OVar1 = peVar2->op;
  if (OVar1 - Shl < 2) {
    std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ir::Reg,void>
              ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)local_98,
               &(peVar2->super_Definition).dest.
                super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_a8,(shared_ptr<mocker::ir::Addr> *)ctx);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_50,(shared_ptr<mocker::ir::Addr> *)ctx);
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>&>
              (text,(shared_ptr<mocker::nasm::Addr> *)local_a8,
               (shared_ptr<mocker::nasm::Addr> *)local_50);
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_60,(shared_ptr<mocker::ir::Addr> *)ctx);
    std::dynamic_pointer_cast<mocker::nasm::NumericConstant,mocker::nasm::Addr>
              ((shared_ptr<mocker::nasm::Addr> *)local_98);
    uVar4 = local_98._0_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
    if ((_Hash_node_base *)uVar4 == (_Hash_node_base *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_98,"",(allocator<char> *)(local_40 + 0x10));
      FuncSelectionContext::newVirtualReg((FuncSelectionContext *)local_40,(string *)ctx);
      std::__cxx11::string::~string((string *)local_98);
      psVar6 = nasm::rcx();
      nasm::Section::
      emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>const&>
                (text,(shared_ptr<mocker::nasm::Register> *)local_40,psVar6);
      psVar6 = nasm::rcx();
      nasm::Section::
      emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Addr>&>
                (text,psVar6,(shared_ptr<mocker::nasm::Addr> *)local_60);
      local_98._0_8_ =
           CONCAT44(local_98._4_4_,
                    (uint)(((inst->
                            super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr)->op == Shr)) | 6;
      psVar6 = nasm::rcx();
      nasm::Section::
      emplaceInst<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Register>const&>
                (text,(OpType *)local_98,(shared_ptr<mocker::nasm::Addr> *)local_a8,psVar6);
      psVar6 = nasm::rcx();
      nasm::Section::
      emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Register>&>
                (text,psVar6,(shared_ptr<mocker::nasm::Register> *)local_40);
      goto LAB_00117ea8;
    }
    local_98._0_8_ =
         CONCAT44(local_98._4_4_,
                  (uint)(((inst->
                          super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->op == Shr)) | 6;
    nasm::Section::
    emplaceInst<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>&>
              (text,(OpType *)local_98,(shared_ptr<mocker::nasm::Addr> *)local_a8,
               (shared_ptr<mocker::nasm::Addr> *)local_60);
  }
  else {
    if (1 < OVar1 - Div) {
      if ((anonymous_namespace)::
          genArithBinary(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::ArithBinaryInst>const&)
          ::opMp == '\0') {
        iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                     genArithBinary(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::ArithBinaryInst>const&)
                                     ::opMp);
        if (iVar5 != 0) {
          local_a8._0_8_ = local_98;
          local_98._0_8_ = (_Hash_node_base *)0x300000005;
          local_98._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x400000006;
          local_98._16_8_ = (_Hash_node_base *)0x500000007;
          local_98._24_8_ = 0x100000001;
          local_98._32_8_ = (__node_base_ptr)0x0;
          pp_Stack_70 = (__buckets_ptr)0x200000002;
          local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
          SmallMap<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType>::SmallMap
                    (&genArithBinary::opMp,
                     (initializer_list<std::pair<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType>_>
                      *)local_a8);
          __cxa_atexit(SmallMap<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType>
                       ::~SmallMap,&genArithBinary::opMp,&__dso_handle);
          __cxa_guard_release(&(anonymous_namespace)::
                               genArithBinary(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::ArithBinaryInst>const&)
                               ::opMp);
        }
      }
      std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mocker::ir::Reg,void>
                ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)local_a8,
                 &(((inst->
                    super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_Definition).dest.
                  super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
      FuncSelectionContext::getIrAddr
                ((FuncSelectionContext *)local_98,(shared_ptr<mocker::ir::Addr> *)ctx);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
      FuncSelectionContext::getIrAddr
                ((FuncSelectionContext *)local_a8,(shared_ptr<mocker::ir::Addr> *)ctx);
      nasm::Section::
      emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>>
                (text,(shared_ptr<mocker::nasm::Addr> *)local_98,
                 (shared_ptr<mocker::nasm::Addr> *)local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
      local_50._0_4_ =
           ((inst->super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr)->op;
      args = SmallMap<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType>::at
                       (&genArithBinary::opMp,(OpType *)local_50);
      FuncSelectionContext::getIrAddr
                ((FuncSelectionContext *)local_a8,(shared_ptr<mocker::ir::Addr> *)ctx);
      nasm::Section::
      emplaceInst<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType_const&,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>>
                (text,args,(shared_ptr<mocker::nasm::Addr> *)local_98,
                 (shared_ptr<mocker::nasm::Addr> *)local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
      puVar3 = local_98;
      goto LAB_00117ecb;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_98,"",(allocator<char> *)local_50);
    FuncSelectionContext::newVirtualReg((FuncSelectionContext *)local_a8,(string *)ctx);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_98,"",(allocator<char> *)local_60);
    FuncSelectionContext::newVirtualReg((FuncSelectionContext *)local_50,(string *)ctx);
    std::__cxx11::string::~string((string *)local_98);
    psVar6 = nasm::rdx();
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>const&>
              (text,(shared_ptr<mocker::nasm::Register> *)local_50,psVar6);
    psVar6 = nasm::rax();
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>const&>
              (text,(shared_ptr<mocker::nasm::Register> *)local_a8,psVar6);
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_60,(shared_ptr<mocker::ir::Addr> *)ctx);
    psVar6 = nasm::rax();
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Addr>&>
              (text,psVar6,(shared_ptr<mocker::nasm::Addr> *)local_60);
    nasm::Section::emplaceInst<mocker::nasm::Cqo>(text);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_98,"",(allocator<char> *)(local_40 + 0x10));
    FuncSelectionContext::newVirtualReg((FuncSelectionContext *)local_40,(string *)ctx);
    std::__cxx11::string::~string((string *)local_98);
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_98,(shared_ptr<mocker::ir::Addr> *)ctx);
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Addr>>
              (text,(shared_ptr<mocker::nasm::Register> *)local_40,
               (shared_ptr<mocker::nasm::Addr> *)local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
    nasm::Section::emplaceInst<mocker::nasm::IDiv,std::shared_ptr<mocker::nasm::Register>&>
              (text,(shared_ptr<mocker::nasm::Register> *)local_40);
    std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ir::Reg,void>
              ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)(local_40 + 0x10),
               &(((inst->super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr)->super_Definition).dest.
                super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_98,(shared_ptr<mocker::ir::Addr> *)ctx);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
    if (((inst->super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ->op == Mod) {
      psVar6 = nasm::rdx();
    }
    else {
      psVar6 = nasm::rax();
    }
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Register>const&>
              (text,(shared_ptr<mocker::nasm::Addr> *)local_98,psVar6);
    psVar6 = nasm::rdx();
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Register>&>
              (text,psVar6,(shared_ptr<mocker::nasm::Register> *)local_50);
    psVar6 = nasm::rax();
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Register>&>
              (text,psVar6,(shared_ptr<mocker::nasm::Register> *)local_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
LAB_00117ea8:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  puVar3 = local_a8;
LAB_00117ecb:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar3 + 8));
  return;
}

Assistant:

void genArithBinary(nasm::Section &text, FuncSelectionContext &ctx,
                    const std::shared_ptr<ir::ArithBinaryInst> &inst) {
  if (inst->getOp() == ir::ArithBinaryInst::Mod ||
      inst->getOp() == ir::ArithBinaryInst::Div) {
    auto raxCopy = ctx.newVirtualReg(), rdxCopy = ctx.newVirtualReg();
    text.emplaceInst<nasm::Mov>(rdxCopy, nasm::rdx());
    text.emplaceInst<nasm::Mov>(raxCopy, nasm::rax());

    auto lhs = ctx.getIrAddr(inst->getLhs());
    text.emplaceInst<nasm::Mov>(nasm::rax(), lhs);
    text.emplaceInst<nasm::Cqo>();
    //    text.emplaceInst<nasm::Mov>(nasm::rdx(),
    //                                std::make_shared<nasm::NumericConstant>(0));

    auto divisor = ctx.newVirtualReg();
    text.emplaceInst<nasm::Mov>(divisor, ctx.getIrAddr(inst->getRhs()));
    text.emplaceInst<nasm::IDiv>(divisor);

    auto dest = ctx.getIrAddr(inst->getDest());
    if (inst->getOp() == ir::ArithBinaryInst::Mod)
      text.emplaceInst<nasm::Mov>(dest, nasm::rdx());
    else
      text.emplaceInst<nasm::Mov>(dest, nasm::rax());
    text.emplaceInst<nasm::Mov>(nasm::rdx(), rdxCopy);
    text.emplaceInst<nasm::Mov>(nasm::rax(), raxCopy);
    return;
  }

  if (inst->getOp() == ir::ArithBinaryInst::Shr ||
      inst->getOp() == ir::ArithBinaryInst::Shl) {
    auto dest = ctx.getIrAddr(inst->getDest());
    auto lhs = ctx.getIrAddr(inst->getLhs());
    text.emplaceInst<nasm::Mov>(dest, lhs);
    auto rhs = ctx.getIrAddr(inst->getRhs());

    if (nasm::dyc<nasm::NumericConstant>(rhs)) {
      text.emplaceInst<nasm::BinaryInst>(
          inst->getOp() == ir::ArithBinaryInst::Shr ? nasm::BinaryInst::Sar
                                                    : nasm::BinaryInst::Sal,
          dest, rhs);
      return;
    }

    auto rcxCopy = ctx.newVirtualReg();
    text.emplaceInst<nasm::Mov>(rcxCopy, nasm::rcx());
    text.emplaceInst<nasm::Mov>(nasm::rcx(), rhs);
    text.emplaceInst<nasm::BinaryInst>(inst->getOp() == ir::ArithBinaryInst::Shr
                                           ? nasm::BinaryInst::Sar
                                           : nasm::BinaryInst::Sal,
                                       dest, nasm::rcx());
    text.emplaceInst<nasm::Mov>(nasm::rcx(), rcxCopy);
    return;
  }

  static const SmallMap<ir::ArithBinaryInst::OpType, nasm::BinaryInst::OpType>
      opMp{
          {ir::ArithBinaryInst::Add, nasm::BinaryInst::Add},
          {ir::ArithBinaryInst::Sub, nasm::BinaryInst::Sub},
          {ir::ArithBinaryInst::Mul, nasm::BinaryInst::Mul},
          {ir::ArithBinaryInst::BitAnd, nasm::BinaryInst::BitAnd},
          {ir::ArithBinaryInst::BitOr, nasm::BinaryInst::BitOr},
          {ir::ArithBinaryInst::Xor, nasm::BinaryInst::Xor},
      };
  auto dest = ctx.getIrAddr(inst->getDest());
  text.emplaceInst<nasm::Mov>(dest, ctx.getIrAddr(inst->getLhs()));
  text.emplaceInst<nasm::BinaryInst>(opMp.at(inst->getOp()), dest,
                                     ctx.getIrAddr(inst->getRhs()));
}